

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint64_t fletcher2(char *key,int len,uint64_t seed)

{
  int iVar1;
  uint64_t uVar2;
  long *plVar3;
  long lVar4;
  uint64_t *dataw;
  
  iVar1 = len + 7;
  if (-1 < len) {
    iVar1 = len;
  }
  plVar3 = (long *)key;
  if (len < 8) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      seed = seed + *plVar3;
      uVar2 = uVar2 + seed;
      plVar3 = plVar3 + 1;
    } while (plVar3 < key + (long)(iVar1 >> 3) * 8);
  }
  if (((len & 7U) != 0) && (plVar3 < key + len)) {
    lVar4 = 0;
    do {
      seed = seed + *(byte *)((long)plVar3 + lVar4);
      uVar2 = uVar2 + seed;
      lVar4 = lVar4 + 1;
    } while ((long)(key + len) - (long)plVar3 != lVar4);
  }
  return uVar2;
}

Assistant:

uint64_t
fletcher2(const char *key, int len, uint64_t seed)
{
  uint64_t *dataw = (uint64_t *)key;
  const uint64_t *const endw = &((const uint64_t*)key)[len/8];
  uint64_t A = seed, B = 0;
  for (; dataw < endw; dataw++) {
    A += *dataw;
    B += A;
  }
  if (len & 7) {
    uint8_t *datac = (uint8_t*)dataw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    for (; datac < endc; datac++) {
      A += *datac;
      B += A;
    }
  }
  return B;
}